

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_steal(command *cmd)

{
  wchar_t wVar1;
  wchar_t local_14;
  command *pcStack_10;
  wchar_t dir;
  command *cmd_local;
  
  pcStack_10 = cmd;
  wVar1 = cmd_get_direction(cmd,"direction",&local_14,false);
  if (wVar1 == L'\0') {
    do_cmd_steal_aux(local_14);
  }
  return;
}

Assistant:

void do_cmd_steal(struct command *cmd)
{
	int dir;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
		return;

	do_cmd_steal_aux(dir);
}